

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hxx
# Opt level: O2

void __thiscall nuraft::context::~context(context *this)

{
  std::_Function_base::~_Function_base((_Function_base *)&this->cb_func_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->params_).super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->scheduler_).
              super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->rpc_cli_factory_).
              super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->logger_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->rpc_listener_).
              super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->state_machine_).
              super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->state_mgr_).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

context( ptr<state_mgr>& mgr,
             ptr<state_machine>& m,
             ptr<rpc_listener>& listener,
             ptr<logger>& l,
             ptr<rpc_client_factory>& cli_factory,
             ptr<delayed_task_scheduler>& scheduler,
             const raft_params& params )
        : state_mgr_(mgr)
        , state_machine_(m)
        , rpc_listener_(listener)
        , logger_(l)
        , rpc_cli_factory_(cli_factory)
        , scheduler_(scheduler)
        , params_( cs_new<raft_params>(params) )
        {}